

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall
clickhouse::NetworkAddress::NetworkAddress(NetworkAddress *this,string *host,string *port)

{
  int iVar1;
  const_iterator cVar2;
  system_error *this_00;
  int *piVar3;
  error_category *__ecat;
  LocalNames *this_01;
  addrinfo local_58;
  
  this->info_ = (addrinfo *)0x0;
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  if (Singleton<clickhouse::(anonymous_namespace)::LocalNames>()::instance == '\0') {
    this_01 = (LocalNames *)&Singleton<clickhouse::(anonymous_namespace)::LocalNames>()::instance;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      anon_unknown_4::LocalNames::LocalNames(this_01);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   Singleton<clickhouse::(anonymous_namespace)::LocalNames>()::instance,
                   &__dso_handle);
      __cxa_guard_release(&Singleton<clickhouse::(anonymous_namespace)::LocalNames>()::instance);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)Singleton<clickhouse::(anonymous_namespace)::LocalNames>()::instance,host);
  if (cVar2.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_58._0_8_ = local_58._0_8_ | 0x20;
  }
  iVar1 = getaddrinfo((host->_M_dataplus)._M_p,(port->_M_dataplus)._M_p,&local_58,(addrinfo **)this)
  ;
  if (iVar1 == 0) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,iVar1,__ecat);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

NetworkAddress::NetworkAddress(const std::string& host, const std::string& port)
    : info_(nullptr)
{
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));

    hints.ai_family = PF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    if (!Singleton<LocalNames>()->IsLocalName(host)) {
        // https://linux.die.net/man/3/getaddrinfo
        // If hints.ai_flags includes the AI_ADDRCONFIG flag,
        // then IPv4 addresses are returned in the list pointed to by res only
        // if the local system has at least one IPv4 address configured,
        // and IPv6 addresses are only returned if the local system
        // has at least one IPv6 address configured.
        // The loopback address is not considered for this case
        // as valid as a configured address.
        hints.ai_flags |= AI_ADDRCONFIG;
    }

    const int error = getaddrinfo(host.c_str(), port.c_str(), &hints, &info_);

    if (error) {
        throw std::system_error(errno, std::system_category());
    }
}